

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O2

void google::protobuf::compiler::java::ReportUnexpectedPackedFieldsCall(void)

{
  LogMessage *this;
  LogMessage LStack_18;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/generator_common.h"
             ,0x50);
  this = absl::lts_20250127::log_internal::LogMessage::operator<<
                   (&LStack_18,(char (*) [40])"GenerateBuilderParsingCodeFromPacked() ");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (this,(char (*) [57])"called on field generator that does not support packing.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

inline void ReportUnexpectedPackedFieldsCall() {
  // Reaching here indicates a bug. Cases are:
  //   - This FieldGenerator should support packing,
  //     but this method should be overridden.
  //   - This FieldGenerator doesn't support packing, and this method
  //     should never have been called.
  ABSL_LOG(FATAL) << "GenerateBuilderParsingCodeFromPacked() "
                  << "called on field generator that does not support packing.";
}